

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O1

Descriptor * upb_test::AddMessageDescriptor(MessageDefPtr msgdef,DescriptorPool *pool)

{
  upb_Arena *a;
  upb_FileDef *f;
  google_protobuf_FileDescriptorProto *msg;
  FileDescriptor *pFVar1;
  char *__s;
  size_t sVar2;
  Descriptor *pDVar3;
  size_t *size_00;
  pointer *__ptr;
  string_view name;
  AssertionResult gtest_ar_;
  size_t size;
  FileDescriptorProto google_proto;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_160;
  AssertHelper local_158;
  internal local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  int local_140 [2];
  string local_138;
  FileDescriptorProto local_118;
  
  a = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  f = upb_MessageDef_File(msgdef.ptr_);
  msg = upb_FileDef_ToProto(f,a);
  size_00 = (size_t *)local_140;
  upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,
             &google__protobuf__FileDescriptorProto_msg_init,0,a,(char **)&local_118,size_00);
  google::protobuf::FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  google::protobuf::MessageLite::ParseFromArray
            ((MessageLite *)&local_118,local_118.super_Message.super_MessageLite._vptr_MessageLite,
             local_140[0]);
  pFVar1 = google::protobuf::DescriptorPool::BuildFile(pool,&local_118);
  local_150[0] = (internal)(pFVar1 != (FileDescriptor *)0x0);
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_150[0]) {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,local_150,(AssertionResult *)"file_desc != nullptr","false","true",
               (char *)size_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.cc"
               ,0x2d,local_138._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_160._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._M_head_impl + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  __s = upb_MessageDef_FullName(msgdef.ptr_);
  sVar2 = strlen(__s);
  name._M_str = __s;
  name._M_len = sVar2;
  pDVar3 = google::protobuf::DescriptorPool::FindMessageTypeByName(pool,name);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_118);
  if (a != (upb_Arena *)0x0) {
    upb_Arena_Free(a);
  }
  return pDVar3;
}

Assistant:

const google::protobuf::Descriptor* AddMessageDescriptor(
    upb::MessageDefPtr msgdef, google::protobuf::DescriptorPool* pool) {
  upb::Arena tmp_arena;
  upb::FileDefPtr file = msgdef.file();
  google_protobuf_FileDescriptorProto* upb_proto =
      upb_FileDef_ToProto(file.ptr(), tmp_arena.ptr());
  size_t size;
  const char* buf = google_protobuf_FileDescriptorProto_serialize(
      upb_proto, tmp_arena.ptr(), &size);
  google::protobuf::FileDescriptorProto google_proto;
  google_proto.ParseFromArray(buf, size);
  const google::protobuf::FileDescriptor* file_desc =
      pool->BuildFile(google_proto);
  EXPECT_TRUE(file_desc != nullptr);
  return pool->FindMessageTypeByName(msgdef.full_name());
}